

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_thread.cpp
# Opt level: O2

void __thiscall rw_shared_thread::operator()(rw_shared_thread *this)

{
  ostream *poVar1;
  runtime_error *this_00;
  ptime pVar2;
  ptime pVar3;
  string asStack_1d8 [32];
  undefined1 local_1b8 [12];
  undefined1 local_1a8 [12];
  ostringstream oss;
  
  booster::recursive_shared_mutex::shared_lock();
  booster::ptime::millisleep(500);
  local_1a8 = booster::ptime::now();
  booster::recursive_shared_mutex::shared_lock();
  local_1b8 = booster::ptime::now();
  booster::ptime::millisleep(200);
  booster::recursive_shared_mutex::unlock();
  booster::recursive_shared_mutex::unlock();
  pVar2 = booster::ptime::operator-((ptime *)local_1b8,(ptime *)local_1a8);
  pVar3 = booster::ptime::milliseconds(100);
  if ((pVar3.sec <= pVar2.sec) && ((pVar3.sec < pVar2.sec || (pVar3.nsec <= pVar2.nsec)))) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar1 = std::operator<<((ostream *)&oss,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xb1);
    std::operator<<(poVar1," end-start < booster::ptime::milliseconds(100)");
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(this_00,asStack_1d8);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  *this->done = true;
  return;
}

Assistant:

void operator()() const
	{
		lp->shared_lock();
		booster::ptime::millisleep(500);
		booster::ptime start = booster::ptime::now();
		lp->shared_lock();
		booster::ptime end = booster::ptime::now();
		booster::ptime::millisleep(200);
		lp->unlock();
		lp->unlock();
		TEST(end-start < booster::ptime::milliseconds(100));
		*done = true;
	}